

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::NamedPortConnectionSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,NamedPortConnectionSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (NamedPortConnectionSyntax *)0x0:
    return __return_storage_ptr__ + 2;
  case (NamedPortConnectionSyntax *)0x1:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 5);
    break;
  case (NamedPortConnectionSyntax *)0x2:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 6);
    break;
  case (NamedPortConnectionSyntax *)0x3:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 7);
    break;
  case (NamedPortConnectionSyntax *)0x4:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[8].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  case (NamedPortConnectionSyntax *)0x5:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[8].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax NamedPortConnectionSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &dot;
        case 2: return &name;
        case 3: return &openParen;
        case 4: return expr;
        case 5: return &closeParen;
        default: return nullptr;
    }
}